

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-io.c
# Opt level: O3

void borg_note_internal(_Bool warning,char *what)

{
  char *pcVar1;
  size_t sVar2;
  ushort **ppuVar3;
  short sVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  undefined7 in_register_00000039;
  long lVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  wchar_t h;
  wchar_t w;
  wchar_t x;
  char buf [1024];
  wchar_t local_454;
  wchar_t local_450;
  int local_44c;
  term *local_448;
  int local_43c;
  char local_438 [1032];
  
  local_448 = Term;
  if ((int)CONCAT71(in_register_00000039,warning) == 0) {
    message_add(what,0);
  }
  else {
    msg("%s",what);
  }
  pcVar1 = strstr(what,"Best Combo");
  if ((pcVar1 != (char *)0x0) || (pcVar1 = strstr(what,"Taking off "), pcVar1 != (char *)0x0)) {
    sVar4 = borg.time_this_panel + 10;
    borg.time_this_panel = sVar4;
    pcVar1 = format("# Anti-loop variable tick (%d).",(ulong)(uint)(int)sVar4);
    borg_note_internal(false,pcVar1);
  }
  lVar10 = 0;
  do {
    if ((angband_term[lVar10] != (term *)0x0) &&
       ((*(byte *)((long)window_flag + lVar10 * 4 + 1) & 0x40) != 0)) {
      Term_activate(angband_term[lVar10]);
      Term_get_size(&local_44c,&local_450);
      Term_locate(&local_43c,&local_454);
      Term_erase(L'\0',local_454,L'ÿ');
      sVar2 = strlen(what);
      uVar7 = local_44c - 2;
      if ((int)uVar7 < (int)sVar2) {
        do {
          iVar11 = local_44c / 2;
          if (iVar11 < (int)uVar7) {
            ppuVar3 = __ctype_b_loc();
            lVar5 = (long)(int)uVar7;
            lVar8 = 0;
            do {
              if ((*(byte *)((long)*ppuVar3 + (long)what[lVar8 + iVar11] * 2 + 1) & 0x20) != 0) {
                uVar7 = iVar11 + (int)lVar8;
              }
              lVar8 = lVar8 + 1;
            } while (lVar5 - iVar11 != lVar8);
          }
          if ((int)uVar7 < 1) {
            uVar9 = 0;
          }
          else {
            uVar6 = 0;
            do {
              local_438[uVar6] = what[uVar6];
              uVar6 = uVar6 + 1;
              uVar9 = uVar7;
            } while (uVar7 != uVar6);
          }
          (local_438 + uVar9)[0] = '\\';
          (local_438 + uVar9)[1] = '\0';
          Term_addstr(L'\xffffffff',L'\x01',local_438);
          local_454 = local_454 + L'\x01';
          if (local_450 <= local_454) {
            local_454 = L'\0';
          }
          Term_erase(L'\0',local_454,L'ÿ');
          what = what + (int)uVar7;
          uVar9 = (int)sVar2 - uVar7;
          sVar2 = (size_t)uVar9;
          uVar7 = local_44c - 2;
        } while ((int)uVar7 < (int)uVar9);
      }
      Term_addstr(L'\xffffffff',L'\x01',what);
      local_454 = local_454 + L'\x01';
      if (local_450 <= local_454) {
        local_454 = L'\0';
      }
      Term_erase(L'\0',local_454,L'ÿ');
      Term_fresh();
      Term_activate(local_448);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 8);
  return;
}

Assistant:

static void borg_note_internal(bool warning, const char *what)
{
    int j, n, i, k;

    int w, h, x, y;

    term *old = Term;

    /* Memorize it */
    if (warning) {
        msg("%s", what);
    } else {
        message_add(what, MSG_GENERIC);
    }

    /* Log the message */
    borg_info(what);

    /* Mega-Hack -- Check against the swap loops */
    if (strstr(what, "Best Combo") || strstr(what, "Taking off ")) {
        /* Tick the anti loop clock */
        borg.time_this_panel += 10;
        borg_note(
            format("# Anti-loop variable tick (%d).", borg.time_this_panel));
    }

    /* Scan windows */
    for (j = 0; j < 8; j++) {
        if (!angband_term[j])
            continue;

        /* Check flag */
        if (!(window_flag[j] & PW_BORG_1))
            continue;

        /* Activate */
        Term_activate(angband_term[j]);

        /* Access size */
        Term_get_size(&w, &h);

        /* Access cursor */
        Term_locate(&x, &y);

        /* Erase current line */
        Term_erase(0, y, 255);

        /* Total length */
        n = strlen(what);

        /* Too long */
        if (n > w - 2) {
            char buf[1024];

            /* Split */
            while (n > w - 2) {
                /* Default */
                k = w - 2;

                /* Find a split point */
                for (i = w / 2; i < w - 2; i++) {
                    /* Pre-emptive split point */
                    if (isspace(what[i]))
                        k = i;
                }

                /* Copy over the split message */
                for (i = 0; i < k; i++) {
                    /* Copy */
                    buf[i] = what[i];
                }

                /* Indicate split */
                buf[i++] = '\\';

                /* Terminate */
                buf[i] = '\0';

                /* Show message */
                Term_addstr(-1, COLOUR_WHITE, buf);

                /* Advance (wrap) */
                if (++y >= h)
                    y = 0;

                /* Erase next line */
                Term_erase(0, y, 255);

                /* Advance */
                what += k;

                /* Reduce */
                n -= k;
            }

            /* Show message tail */
            Term_addstr(-1, COLOUR_WHITE, what);

            /* Advance (wrap) */
            if (++y >= h)
                y = 0;

            /* Erase next line */
            Term_erase(0, y, 255);
        }

        /* Normal */
        else {
            /* Show message */
            Term_addstr(-1, COLOUR_WHITE, what);

            /* Advance (wrap) */
            if (++y >= h)
                y = 0;

            /* Erase next line */
            Term_erase(0, y, 255);
        }

        /* Flush output */
        Term_fresh();

        /* Use correct window */
        Term_activate(old);
    }
}